

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<const_void_*const_&> __thiscall
kj::Table<void_const*,kj::HashIndex<kj::_::HashSetCallbacks>>::find<0ul,void_const*&>
          (Table<void_const*,kj::HashIndex<kj::_::HashSetCallbacks>> *this,Entry *params)

{
  long lVar1;
  ArrayPtr<const_void_*const> table;
  char local_28;
  size_t local_20;
  
  table.ptr = params + 2;
  table.size_ = params->key;
  HashIndex<kj::_::HashSetCallbacks>::find<void_const*const,void_const*&>
            ((HashIndex<kj::_::HashSetCallbacks> *)&local_28,table,
             (Entry *)((long)((long)(params->value).super_Schema.raw - params->key) >> 3));
  if (local_28 == '\x01') {
    lVar1 = local_20 * 8 + params->key;
  }
  else {
    lVar1 = 0;
  }
  *(long *)this = lVar1;
  return (Maybe<const_void_*const_&>)(Entry *)this;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}